

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

int64_t __thiscall absl::ToUnixNanos(absl *this,Time t)

{
  int64_t iVar1;
  long lVar2;
  Duration num;
  Duration local_18;
  
  if ((ulong)this >> 0x21 != 0) {
    local_18.rep_hi_ = 0;
    local_18.rep_lo_ = 0;
    num._8_8_ = t.rep_.rep_hi_ & 0xffffffff;
    num.rep_hi_ = (int64_t)this;
    iVar1 = time_internal::IDivDuration(true,num,(Duration)(ZEXT816(4) << 0x40),&local_18);
    lVar2 = iVar1 + -1;
    if (-1 < local_18.rep_hi_) {
      lVar2 = iVar1;
    }
    if (0 < iVar1) {
      lVar2 = iVar1;
    }
    return lVar2;
  }
  return (ulong)((uint)t.rep_.rep_hi_ >> 2) + (long)this * 1000000000;
}

Assistant:

int64_t ToUnixNanos(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 33 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) *
            1000 * 1000 * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) / 4);
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Nanoseconds(1));
}